

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-dump-file.cpp
# Opt level: O1

bool readULong(FILE *stream,uint64_t *value)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  size_t i;
  long lVar4;
  bool bVar5;
  uint8_t v [8];
  fpos_t pos;
  byte local_30 [8];
  fpos_t local_28;
  
  *value = 0;
  iVar1 = fgetpos((FILE *)stream,&local_28);
  if (iVar1 == 0) {
    sVar2 = fread(local_30,1,8,(FILE *)stream);
    bVar5 = sVar2 == 8;
    if (bVar5) {
      uVar3 = *value;
      lVar4 = 0;
      do {
        uVar3 = (ulong)local_30[lVar4] | uVar3 << 8;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      *value = uVar3;
    }
    else {
      fsetpos((FILE *)stream,&local_28);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool readULong(FILE* stream, uint64_t& value)
{
	value = 0;
	fpos_t pos;
	if (fgetpos(stream, &pos) != 0)
	{
		return false;
	}
	uint8_t v[8];
	if (fread(v, 1, 8, stream) != 8)
	{
		(void) fsetpos(stream, &pos);
		return false;
	}
	for (size_t i = 0; i < 8; i++)
	{
		value <<= 8;
		value += v[i];
	}
	return true;
}